

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O0

Own<kj::(anonymous_namespace)::PipeWriteEnd> __thiscall
kj::heap<kj::(anonymous_namespace)::PipeWriteEnd,kj::Own<kj::(anonymous_namespace)::AsyncPipe>>
          (kj *this,Own<kj::(anonymous_namespace)::AsyncPipe> *params)

{
  PipeWriteEnd *this_00;
  Own<kj::(anonymous_namespace)::AsyncPipe> *other;
  PipeWriteEnd *extraout_RDX;
  Own<kj::(anonymous_namespace)::PipeWriteEnd> OVar1;
  Own<kj::(anonymous_namespace)::AsyncPipe> local_28;
  NoInfer<kj::Own<kj::(anonymous_namespace)::AsyncPipe>_> *local_18;
  Own<kj::(anonymous_namespace)::AsyncPipe> *params_local;
  
  local_18 = params;
  params_local = (Own<kj::(anonymous_namespace)::AsyncPipe> *)this;
  this_00 = (PipeWriteEnd *)operator_new(0x20);
  other = fwd<kj::Own<kj::(anonymous_namespace)::AsyncPipe>>(local_18);
  Own<kj::(anonymous_namespace)::AsyncPipe>::Own(&local_28,other);
  anon_unknown_77::PipeWriteEnd::PipeWriteEnd(this_00,&local_28);
  Own<kj::(anonymous_namespace)::PipeWriteEnd>::Own
            ((Own<kj::(anonymous_namespace)::PipeWriteEnd> *)this,this_00,
             (Disposer *)&_::HeapDisposer<kj::(anonymous_namespace)::PipeWriteEnd>::instance);
  Own<kj::(anonymous_namespace)::AsyncPipe>::~Own(&local_28);
  OVar1.ptr = extraout_RDX;
  OVar1.disposer = (Disposer *)this;
  return OVar1;
}

Assistant:

Own<T> heap(Params&&... params) {
  // heap<T>(...) allocates a T on the heap, forwarding the parameters to its constructor.  The
  // exact heap implementation is unspecified -- for now it is operator new, but you should not
  // assume this.  (Since we know the object size at delete time, we could actually implement an
  // allocator that is more efficient than operator new.)

  return Own<T>(new T(kj::fwd<Params>(params)...), _::HeapDisposer<T>::instance);
}